

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.c
# Opt level: O2

int formk_(integer *n,integer *nsub,integer *ind,integer *nenter,integer *ileave,integer *indx2,
          integer *iupdat,logical *updatd,doublereal *wn,doublereal *wn1,integer *m,doublereal *ws,
          doublereal *wy,doublereal *sy,doublereal *theta,integer *col,integer *head,integer *info)

{
  uint uVar1;
  uint uVar2;
  doublereal dVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  integer iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  doublereal *pdVar19;
  ulong uVar20;
  ulong uVar21;
  double *pdVar22;
  double *pdVar23;
  ulong uVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  uint uVar28;
  doublereal *pdVar29;
  doublereal *pdVar30;
  doublereal dVar31;
  uint local_b8;
  uint local_b4;
  undefined8 local_b0;
  doublereal *local_a8;
  long local_a0;
  doublereal *local_98;
  doublereal *local_90;
  ulong local_88;
  doublereal *local_80;
  undefined8 local_78;
  uint *local_70;
  double *local_68;
  long local_60;
  uint *local_58;
  long local_50;
  doublereal *local_48;
  doublereal *local_40;
  ulong local_38;
  
  iVar12 = *m;
  local_38 = (ulong)iVar12;
  uVar9 = *n;
  pdVar26 = (double *)(long)(int)uVar9;
  uVar15 = ~(ulong)pdVar26;
  local_b4 = iVar12 * 2;
  local_60 = (long)(int)~local_b4;
  local_98 = wn1 + local_60;
  local_88 = (ulong)(int)local_b4;
  local_50 = ~local_38 << 3;
  local_78 = ileave;
  local_70 = (uint *)n;
  local_68 = pdVar26;
  local_58 = (uint *)nenter;
  if (*updatd == 0) {
    uVar9 = *col;
  }
  else {
    if (iVar12 < *iupdat) {
      local_b0 = (doublereal *)(CONCAT44(local_b0._4_4_,local_b4) | 1);
      local_a8 = (doublereal *)nsub;
      for (formk_::jy = 1; formk_::jy < (int)local_38; formk_::jy = formk_::jy + 1) {
        formk_::js = *m + formk_::jy;
        local_b8 = *m - formk_::jy;
        iVar12 = (int)local_b0;
        Wcopy_((integer *)&local_b8,local_98 + (formk_::jy + 1) * (int)local_b0,&c__1,
               local_98 + formk_::jy * (int)local_b0,&c__1);
        pdVar29 = local_98;
        local_b8 = *m - formk_::jy;
        Wcopy_((integer *)&local_b8,local_98 + (formk_::js + 1) * iVar12,&c__1,
               local_98 + formk_::js * iVar12,&c__1);
        pdVar26 = local_68;
        iVar12 = *m;
        local_b8 = iVar12 - 1;
        Wcopy_((integer *)&local_b8,pdVar29 + (int)((formk_::jy + 1) * local_b4 + iVar12 + 2),&c__1,
               pdVar29 + (int)(iVar12 + formk_::jy * local_b4 + 1),&c__1);
      }
      uVar9 = *local_70;
      iVar12 = *m;
      nsub = (integer *)local_a8;
    }
    uVar24 = 1;
    uVar6 = *nsub;
    iVar5 = *col;
    iVar7 = iVar12 + iVar5;
    iVar4 = *head;
    iVar17 = iVar4 + iVar5 + -1;
    iVar12 = *m;
    iVar18 = 0;
    if (iVar12 < iVar17) {
      iVar18 = iVar12;
    }
    iVar11 = (int)pdVar26;
    iVar18 = (iVar17 - iVar18) * iVar11;
    uVar20 = 0;
    if (0 < (int)uVar6) {
      uVar20 = (ulong)uVar6;
    }
    iVar17 = 0;
    if (0 < iVar5) {
      iVar17 = iVar5;
    }
    local_40 = local_98 + iVar5;
    local_48 = local_98 + iVar7;
    for (; uVar24 != iVar17 + 1; uVar24 = uVar24 + 1) {
      formk_::temp1 = 0.0;
      iVar12 = iVar12 + (int)uVar24;
      formk_::temp2 = 0.0;
      formk_::temp3 = 0.0;
      for (uVar21 = 0; lVar14 = (long)(int)(uVar6 + 1), uVar20 != uVar21; uVar21 = uVar21 + 1) {
        formk_::temp1 =
             formk_::temp1 +
             wy[uVar15 + (long)(iVar18 + ind[uVar21])] *
             wy[uVar15 + (long)(ind[uVar21] + iVar4 * iVar11)];
      }
      for (; dVar3 = formk_::temp3, dVar31 = formk_::temp2, lVar14 <= (int)uVar9;
          lVar14 = lVar14 + 1) {
        lVar16 = (long)(ind[lVar14 + -1] + iVar4 * iVar11);
        formk_::temp2 =
             formk_::temp2 + ws[uVar15 + lVar16] * ws[uVar15 + (long)(iVar18 + ind[lVar14 + -1])];
        formk_::temp3 =
             formk_::temp3 + ws[uVar15 + (long)(iVar18 + ind[lVar14 + -1])] * wy[uVar15 + lVar16];
      }
      formk_::js = iVar12;
      local_40[uVar24 * local_88] = formk_::temp1;
      local_98[(int)(iVar12 * local_b4 + iVar7)] = dVar31;
      local_48[uVar24 * local_88] = dVar3;
      iVar12 = *m;
      iVar4 = iVar4 % iVar12 + 1;
      local_b8 = uVar9;
    }
    formk_::jy = *col;
    iVar5 = *head;
    iVar18 = formk_::jy + iVar5 + -1;
    iVar4 = 0;
    if (iVar12 < iVar18) {
      iVar4 = iVar12;
    }
    iVar17 = formk_::jy * local_b4;
    iVar7 = formk_::jy;
    if (formk_::jy < 1) {
      iVar7 = 0;
    }
    for (iVar8 = 1; iVar8 != iVar7 + 1; iVar8 = iVar8 + 1) {
      iVar13 = iVar12 + iVar8;
      formk_::temp3 = 0.0;
      for (uVar24 = 0; uVar20 != uVar24; uVar24 = uVar24 + 1) {
        formk_::temp3 =
             formk_::temp3 +
             ws[uVar15 + (long)(iVar5 * iVar11 + ind[uVar24])] *
             wy[uVar15 + (long)(ind[uVar24] + (iVar18 - iVar4) * iVar11)];
      }
      iVar12 = *m;
      iVar5 = iVar5 % iVar12 + 1;
      local_98[iVar13 + iVar17] = formk_::temp3;
      local_b8 = uVar6;
    }
    uVar9 = *col - 1;
  }
  uVar24 = local_88;
  local_50 = local_50 + (long)sy;
  local_b0 = wn + local_60;
  iVar5 = *head;
  local_60 = CONCAT44(local_60._4_4_,uVar9);
  uVar6 = 0;
  if (0 < (int)uVar9) {
    uVar6 = uVar9;
  }
  local_a8 = (doublereal *)(ulong)(uVar6 + 1);
  local_a0 = 2;
  pdVar29 = (doublereal *)0x1;
  while (pdVar19 = pdVar29, pdVar19 != local_a8) {
    local_b8 = (uint)pdVar19;
    iVar4 = *head;
    local_40 = (doublereal *)CONCAT44(local_40._4_4_,iVar5);
    iVar18 = iVar5 * (int)pdVar26;
    uVar2 = *local_58;
    if ((int)*local_58 < 1) {
      uVar2 = 0;
    }
    iVar7 = *m;
    uVar1 = *local_70;
    iVar17 = *local_78;
    for (lVar14 = 1; lVar14 != local_a0; lVar14 = lVar14 + 1) {
      uVar28 = iVar7 + (int)lVar14;
      ind = (integer *)(ulong)uVar28;
      iVar11 = iVar4 * (int)pdVar26;
      formk_::temp2 = 0.0;
      formk_::temp1 = 0.0;
      for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
        lVar16 = (long)(iVar18 + indx2[uVar20]);
        lVar25 = (long)(indx2[uVar20] + iVar11);
        formk_::temp2 = formk_::temp2 + ws[uVar15 + lVar25] * ws[uVar15 + lVar16];
        formk_::temp1 = formk_::temp1 + wy[uVar15 + lVar25] * wy[uVar15 + lVar16];
      }
      formk_::temp4 = 0.0;
      formk_::temp3 = 0.0;
      for (lVar16 = (long)iVar17; lVar16 <= (int)uVar1; lVar16 = lVar16 + 1) {
        lVar27 = (long)(iVar18 + indx2[lVar16 + -1]);
        lVar25 = (long)(indx2[lVar16 + -1] + iVar11);
        formk_::temp4 = formk_::temp4 + ws[uVar15 + lVar25] * ws[uVar15 + lVar27];
        formk_::temp3 = formk_::temp3 + wy[uVar15 + lVar25] * wy[uVar15 + lVar27];
      }
      local_98[(long)((long)pdVar19 + lVar14 * local_88)] =
           (formk_::temp1 + local_98[(long)((long)pdVar19 + lVar14 * local_88)]) - formk_::temp3;
      iVar11 = uVar28 * local_b4 + iVar12 + local_b8;
      local_98[iVar11] = (local_98[iVar11] - formk_::temp2) + formk_::temp4;
      iVar4 = iVar4 % iVar7 + 1;
      pdVar26 = local_68;
    }
    formk_::js = (integer)ind;
    formk_::jy = (integer)local_a0;
    iVar12 = *m;
    iVar5 = iVar5 % iVar12 + 1;
    local_a0 = local_a0 + 1;
    local_48 = pdVar19;
    pdVar29 = (doublereal *)((long)pdVar19 + 1);
  }
  iVar5 = *head;
  lVar14 = (long)iVar12;
  while (lVar16 = lVar14 + 1, lVar14 < (int)(iVar12 + uVar9)) {
    iVar4 = *head;
    local_a0 = CONCAT44(local_a0._4_4_,iVar5);
    iVar18 = iVar5 * (int)pdVar26;
    for (pdVar29 = (doublereal *)0x1; pdVar29 != local_a8;
        pdVar29 = (doublereal *)((long)pdVar29 + 1)) {
      formk_::temp1 = 0.0;
      formk_::temp3 = 0.0;
      iVar7 = iVar4 * (int)pdVar26;
      uVar2 = *local_58;
      if ((int)*local_58 < 1) {
        uVar2 = 0;
      }
      for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
        formk_::temp1 =
             formk_::temp1 +
             ws[uVar15 + (long)(iVar18 + indx2[uVar20])] *
             wy[uVar15 + (long)(indx2[uVar20] + iVar7)];
      }
      for (lVar25 = (long)*local_78; lVar25 <= (int)*local_70; lVar25 = lVar25 + 1) {
        formk_::temp3 =
             formk_::temp3 +
             ws[uVar15 + (long)(iVar18 + indx2[lVar25 + -1])] *
             wy[uVar15 + (long)(indx2[lVar25 + -1] + iVar7)];
      }
      iVar7 = *m;
      lVar25 = (long)pdVar29 * local_88;
      if (lVar14 < iVar7 + (int)pdVar29) {
        local_98[lVar16 + lVar25] = (formk_::temp1 + local_98[lVar16 + lVar25]) - formk_::temp3;
      }
      else {
        local_98[lVar16 + lVar25] = (local_98[lVar16 + lVar25] - formk_::temp1) + formk_::temp3;
      }
      iVar4 = iVar4 % iVar7 + 1;
      pdVar26 = local_68;
    }
    iVar5 = iVar5 % *m + 1;
    lVar14 = lVar16;
    formk_::jy = uVar6 + 1;
    local_b8 = uVar9;
  }
  formk_::is = (integer)lVar16;
  formk_::m2 = *m * 2;
  uVar9 = *col;
  iVar12 = (int)local_38 + 1;
  local_58 = (uint *)CONCAT44(local_58._4_4_,iVar12);
  local_78 = (integer *)(CONCAT44(local_78._4_4_,local_b4) | 1);
  uVar6 = 0;
  if (0 < (int)uVar9) {
    uVar6 = uVar9;
  }
  local_70 = (uint *)CONCAT44(local_70._4_4_,uVar6);
  lVar16 = (long)(int)(-2 - local_b4);
  pdVar19 = wn + local_88 + lVar16 + 2;
  local_90 = wn + lVar16 + 2;
  local_80 = wn1 + local_88 + lVar16 + 1;
  iVar5 = 1;
  lVar14 = -1;
  lVar25 = 0;
  uVar15 = 0;
  pdVar26 = wn1 + local_88 + lVar16 + 2;
  pdVar29 = local_80;
  while (pdVar30 = pdVar29, pdVar22 = pdVar26, uVar20 = uVar15, (uint)uVar20 != uVar6) {
    formk_::is = uVar9 + iVar5;
    iVar4 = *col;
    iVar17 = *m + iVar5;
    local_a0 = CONCAT44(local_a0._4_4_,iVar17);
    iVar7 = (*m + 1) * local_b4 + iVar17;
    iVar11 = (uVar9 + iVar5) * local_b4;
    iVar18 = 1;
    pdVar26 = pdVar22;
    pdVar23 = pdVar22;
    for (lVar16 = 0; lVar14 + lVar16 != 0; lVar16 = lVar16 + 1) {
      pdVar19[lVar16] = *pdVar26 / *theta;
      pdVar23 = (double *)(ulong)(uint)(iVar4 + iVar18);
      local_b0[iVar4 + iVar11 + 1 + (int)lVar16] = local_98[iVar7] * *theta;
      iVar18 = iVar18 + 1;
      pdVar26 = pdVar26 + uVar24;
      iVar7 = iVar7 + local_b4;
    }
    formk_::js = (integer)pdVar23;
    pdVar29 = local_80 + iVar17;
    for (lVar16 = 0; lVar25 != lVar16; lVar16 = lVar16 + 8) {
      *(double *)((long)local_90 + lVar16 + (long)iVar11 * 8) = -*pdVar29;
      pdVar29 = pdVar29 + uVar24;
    }
    uVar9 = *col;
    uVar15 = uVar20 & 0xffffffff;
    if ((int)(uint)uVar20 < (int)uVar9) {
      uVar15 = (ulong)uVar9;
    }
    formk_::jy = (int)uVar15 + 1;
    pdVar29 = pdVar30 + iVar17;
    for (uVar21 = uVar20; uVar15 != uVar21; uVar21 = uVar21 + 1) {
      local_90[(long)iVar11 + uVar21] = *pdVar29;
      pdVar29 = pdVar29 + uVar24;
    }
    local_b0[(int)local_78 * iVar5] =
         *(double *)(local_50 + (long)(iVar12 * iVar5) * 8) + local_b0[(int)local_78 * iVar5];
    iVar5 = iVar5 + 1;
    pdVar19 = pdVar19 + uVar24;
    lVar14 = lVar14 + -1;
    lVar25 = lVar25 + 8;
    pdVar26 = pdVar22 + 1;
    pdVar29 = pdVar30 + uVar24;
    local_b8 = uVar9;
    local_a8 = pdVar30;
    local_88 = uVar20;
    local_68 = pdVar22;
    uVar15 = uVar20 + 1;
  }
  dpofa_(wn,&formk_::m2,col,info);
  if (*info == 0) {
    formk_::js = *col;
    iVar12 = formk_::js * 2;
    formk_::col2 = iVar12;
    while (pdVar29 = local_b0, uVar9 = local_b4, iVar10 = formk_::col2, iVar5 = formk_::js + 1,
          formk_::js < iVar12) {
      formk_::js = iVar5;
      dtrsl_(wn,&formk_::m2,col,local_b0 + (int)(iVar5 * local_b4 | 1),&c__11,info);
    }
    iVar12 = *col;
    formk_::js = iVar5;
    while (iVar5 = iVar12 + 1, formk_::is = iVar5, iVar12 < iVar10) {
      local_b8 = formk_::col2;
      iVar12 = iVar5;
      while (formk_::js = iVar5, iVar5 <= (int)local_b8) {
        dVar31 = Wdot_(col,pdVar29 + (int)(iVar12 * uVar9 | 1),&c__1,
                       pdVar29 + (int)(iVar5 * uVar9 | 1),&c__1);
        iVar12 = formk_::is;
        iVar5 = formk_::js * uVar9 + formk_::is;
        pdVar29[iVar5] = dVar31 + pdVar29[iVar5];
        iVar5 = formk_::js + 1;
      }
    }
    dpofa_(local_b0 + (*col + 1) * (int)local_78,&formk_::m2,col,info);
    iVar10 = -2;
    if (*info == 0) {
      return 0;
    }
  }
  else {
    iVar10 = -1;
  }
  *info = iVar10;
  return 0;
}

Assistant:

int formk_(integer *n, integer *nsub, integer *ind, integer *
	nenter, integer *ileave, integer *indx2, integer *iupdat, logical *
	updatd, doublereal *wn, doublereal *wn1, integer *m, doublereal *ws, 
	doublereal *wy, doublereal *sy, doublereal *theta, integer *col, 
	integer *head, integer *info)
{
    /* System generated locals */
    integer wn_dim1, wn_offset, wn1_dim1, wn1_offset, ws_dim1, ws_offset, 
	    wy_dim1, wy_offset, sy_dim1, sy_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, k, k1, m2, is, js, iy, jy, is1, js1, col2, dend, pend;
    extern doublereal ddot_(integer *, doublereal *, integer *, doublereal *, 
	    integer *);
    static integer upcl;
    static doublereal temp1, temp2, temp3, temp4;
    extern /* Subroutine */ int dpofa_(doublereal *, integer *, integer *, 
	    integer *), dcopy_(integer *, doublereal *, integer *, doublereal 
	    *, integer *), dtrsl_(doublereal *, integer *, integer *, 
	    doublereal *, integer *, integer *);
    static integer ipntr, jpntr, dbegin, pbegin;

/*     ************ */

/*     Subroutine formk */

/*     This subroutine forms  the LEL^T factorization of the indefinite */

/*       matrix    K = [-D -Y'ZZ'Y/theta     L_a'-R_z'  ] */
/*                     [L_a -R_z           theta*S'AA'S ] */
/*                                                    where E = [-I  0] */
/*                                                              [ 0  I] */
/*     The matrix K can be shown to be equal to the matrix M^[-1]N */
/*       occurring in section 5.1 of [1], as well as to the matrix */
/*       Mbar^[-1] Nbar in section 5.3. */

/*     n is an integer variable. */
/*       On entry n is the dimension of the problem. */
/*       On exit n is unchanged. */

/*     nsub is an integer variable */
/*       On entry nsub is the number of subspace variables in free set. */
/*       On exit nsub is not changed. */

/*     ind is an integer array of dimension nsub. */
/*       On entry ind specifies the indices of subspace variables. */
/*       On exit ind is unchanged. */

/*     nenter is an integer variable. */
/*       On entry nenter is the number of variables entering the */
/*         free set. */
/*       On exit nenter is unchanged. */

/*     ileave is an integer variable. */
/*       On entry indx2(ileave),...,indx2(n) are the variables leaving */
/*         the free set. */
/*       On exit ileave is unchanged. */

/*     indx2 is an integer array of dimension n. */
/*       On entry indx2(1),...,indx2(nenter) are the variables entering */
/*         the free set, while indx2(ileave),...,indx2(n) are the */
/*         variables leaving the free set. */
/*       On exit indx2 is unchanged. */

/*     iupdat is an integer variable. */
/*       On entry iupdat is the total number of BFGS updates made so far. */
/*       On exit iupdat is unchanged. */

/*     updatd is a logical variable. */
/*       On entry 'updatd' is true if the L-BFGS matrix is updatd. */
/*       On exit 'updatd' is unchanged. */

/*     wn is a double precision array of dimension 2m x 2m. */
/*       On entry wn is unspecified. */
/*       On exit the upper triangle of wn stores the LEL^T factorization */
/*         of the 2*col x 2*col indefinite matrix */
/*                     [-D -Y'ZZ'Y/theta     L_a'-R_z'  ] */
/*                     [L_a -R_z           theta*S'AA'S ] */

/*     wn1 is a double precision array of dimension 2m x 2m. */
/*       On entry wn1 stores the lower triangular part of */
/*                     [Y' ZZ'Y   L_a'+R_z'] */
/*                     [L_a+R_z   S'AA'S   ] */
/*         in the previous iteration. */
/*       On exit wn1 stores the corresponding updated matrices. */
/*       The purpose of wn1 is just to store these inner products */
/*       so they can be easily updated and inserted into wn. */

/*     m is an integer variable. */
/*       On entry m is the maximum number of variable metric corrections */
/*         used to define the limited memory matrix. */
/*       On exit m is unchanged. */

/*     ws, wy, sy, and wtyy are double precision arrays; */
/*     theta is a double precision variable; */
/*     col is an integer variable; */
/*     head is an integer variable. */
/*       On entry they store the information defining the */
/*                                          limited memory BFGS matrix: */
/*         ws(n,m) stores S, a set of s-vectors; */
/*         wy(n,m) stores Y, a set of y-vectors; */
/*         sy(m,m) stores S'Y; */
/*         wtyy(m,m) stores the Cholesky factorization */
/*                                   of (theta*S'S+LD^(-1)L') */
/*         theta is the scaling factor specifying B_0 = theta I; */
/*         col is the number of variable metric corrections stored; */
/*         head is the location of the 1st s- (or y-) vector in S (or Y). */
/*       On exit they are unchanged. */

/*     info is an integer variable. */
/*       On entry info is unspecified. */
/*       On exit info =  0 for normal return; */
/*                    = -1 when the 1st Cholesky factorization failed; */
/*                    = -2 when the 2st Cholesky factorization failed. */

/*     Subprograms called: */

/*       Linpack ... dcopy, dpofa, dtrsl. */


/*     References: */
/*       [1] R. H. Byrd, P. Lu, J. Nocedal and C. Zhu, ``A limited */
/*       memory algorithm for bound constrained optimization'', */
/*       SIAM J. Scientific Computing 16 (1995), no. 5, pp. 1190--1208. */

/*       [2] C. Zhu, R.H. Byrd, P. Lu, J. Nocedal, ``L-BFGS-B: a */
/*       limited memory FORTRAN code for solving bound constrained */
/*       optimization problems'', Tech. Report, NAM-11, EECS Department, */
/*       Northwestern University, 1994. */

/*       (Postscript files of these papers are available via anonymous */
/*        ftp to eecs.nwu.edu in the directory pub/lbfgs/lbfgs_bcm.) */

/*                           *  *  * */

/*     NEOS, November 1994. (Latest revision June 1996.) */
/*     Optimization Technology Center. */
/*     Argonne National Laboratory and Northwestern University. */
/*     Written by */
/*                        Ciyou Zhu */
/*     in collaboration with R.H. Byrd, P. Lu-Chen and J. Nocedal. */


/*     ************ */
/*     Form the lower triangular part of */
/*               WN1 = [Y' ZZ'Y   L_a'+R_z'] */
/*                     [L_a+R_z   S'AA'S   ] */
/*        where L_a is the strictly lower triangular part of S'AA'Y */
/*              R_z is the upper triangular part of S'ZZ'Y. */
    /* Parameter adjustments */
    --indx2;
    --ind;
    sy_dim1 = *m;
    sy_offset = 1 + sy_dim1;
    sy -= sy_offset;
    wy_dim1 = *n;
    wy_offset = 1 + wy_dim1;
    wy -= wy_offset;
    ws_dim1 = *n;
    ws_offset = 1 + ws_dim1;
    ws -= ws_offset;
    wn1_dim1 = 2 * *m;
    wn1_offset = 1 + wn1_dim1;
    wn1 -= wn1_offset;
    wn_dim1 = 2 * *m;
    wn_offset = 1 + wn_dim1;
    wn -= wn_offset;

    /* Function Body */
    if (*updatd) {
	if (*iupdat > *m) {
/*                                 shift old part of WN1. */
	    i__1 = *m - 1;
	    for (jy = 1; jy <= i__1; ++jy) {
		js = *m + jy;
		i__2 = *m - jy;
		dcopy_(&i__2, &wn1[jy + 1 + (jy + 1) * wn1_dim1], &c__1, &wn1[
			jy + jy * wn1_dim1], &c__1);
		i__2 = *m - jy;
		dcopy_(&i__2, &wn1[js + 1 + (js + 1) * wn1_dim1], &c__1, &wn1[
			js + js * wn1_dim1], &c__1);
		i__2 = *m - 1;
		dcopy_(&i__2, &wn1[*m + 2 + (jy + 1) * wn1_dim1], &c__1, &wn1[
			*m + 1 + jy * wn1_dim1], &c__1);
/* L10: */
	    }
	}
/*          put new rows in blocks (1,1), (2,1) and (2,2). */
	pbegin = 1;
	pend = *nsub;
	dbegin = *nsub + 1;
	dend = *n;
	iy = *col;
	is = *m + *col;
	ipntr = *head + *col - 1;
	if (ipntr > *m) {
	    ipntr -= *m;
	}
	jpntr = *head;
	i__1 = *col;
	for (jy = 1; jy <= i__1; ++jy) {
	    js = *m + jy;
	    temp1 = 0.;
	    temp2 = 0.;
	    temp3 = 0.;
/*             compute element jy of row 'col' of Y'ZZ'Y */
	    i__2 = pend;
	    for (k = pbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp1 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
/* L15: */
	    }
/*             compute elements jy of row 'col' of L_a and S'AA'S */
	    i__2 = dend;
	    for (k = dbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp2 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L16: */
	    }
	    wn1[iy + jy * wn1_dim1] = temp1;
	    wn1[is + js * wn1_dim1] = temp2;
	    wn1[is + jy * wn1_dim1] = temp3;
	    jpntr = jpntr % *m + 1;
/* L20: */
	}
/*          put new column in block (2,1). */
	jy = *col;
	jpntr = *head + *col - 1;
	if (jpntr > *m) {
	    jpntr -= *m;
	}
	ipntr = *head;
	i__1 = *col;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    is = *m + i__;
	    temp3 = 0.;
/*             compute element i of column 'col' of R_z */
	    i__2 = pend;
	    for (k = pbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L25: */
	    }
	    ipntr = ipntr % *m + 1;
	    wn1[is + jy * wn1_dim1] = temp3;
/* L30: */
	}
	upcl = *col - 1;
    } else {
	upcl = *col;
    }
/*       modify the old parts in blocks (1,1) and (2,2) due to changes */
/*       in the set of free variables. */
    ipntr = *head;
    i__1 = upcl;
    for (iy = 1; iy <= i__1; ++iy) {
	is = *m + iy;
	jpntr = *head;
	i__2 = iy;
	for (jy = 1; jy <= i__2; ++jy) {
	    js = *m + jy;
	    temp1 = 0.;
	    temp2 = 0.;
	    temp3 = 0.;
	    temp4 = 0.;
	    i__3 = *nenter;
	    for (k = 1; k <= i__3; ++k) {
		k1 = indx2[k];
		temp1 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
		temp2 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
/* L35: */
	    }
	    i__3 = *n;
	    for (k = *ileave; k <= i__3; ++k) {
		k1 = indx2[k];
		temp3 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
		temp4 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
/* L36: */
	    }
	    wn1[iy + jy * wn1_dim1] = wn1[iy + jy * wn1_dim1] + temp1 - temp3;
	    wn1[is + js * wn1_dim1] = wn1[is + js * wn1_dim1] - temp2 + temp4;
	    jpntr = jpntr % *m + 1;
/* L40: */
	}
	ipntr = ipntr % *m + 1;
/* L45: */
    }
/*       modify the old parts in block (2,1). */
    ipntr = *head;
    i__1 = *m + upcl;
    for (is = *m + 1; is <= i__1; ++is) {
	jpntr = *head;
	i__2 = upcl;
	for (jy = 1; jy <= i__2; ++jy) {
	    temp1 = 0.;
	    temp3 = 0.;
	    i__3 = *nenter;
	    for (k = 1; k <= i__3; ++k) {
		k1 = indx2[k];
		temp1 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L50: */
	    }
	    i__3 = *n;
	    for (k = *ileave; k <= i__3; ++k) {
		k1 = indx2[k];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L51: */
	    }
	    if (is <= jy + *m) {
		wn1[is + jy * wn1_dim1] = wn1[is + jy * wn1_dim1] + temp1 - 
			temp3;
	    } else {
		wn1[is + jy * wn1_dim1] = wn1[is + jy * wn1_dim1] - temp1 + 
			temp3;
	    }
	    jpntr = jpntr % *m + 1;
/* L55: */
	}
	ipntr = ipntr % *m + 1;
/* L60: */
    }
/*     Form the upper triangle of WN = [D+Y' ZZ'Y/theta   -L_a'+R_z' ] */
/*                                     [-L_a +R_z        S'AA'S*theta] */
    m2 = *m << 1;
    i__1 = *col;
    for (iy = 1; iy <= i__1; ++iy) {
	is = *col + iy;
	is1 = *m + iy;
	i__2 = iy;
	for (jy = 1; jy <= i__2; ++jy) {
	    js = *col + jy;
	    js1 = *m + jy;
	    wn[jy + iy * wn_dim1] = wn1[iy + jy * wn1_dim1] / *theta;
	    wn[js + is * wn_dim1] = wn1[is1 + js1 * wn1_dim1] * *theta;
/* L65: */
	}
	i__2 = iy - 1;
	for (jy = 1; jy <= i__2; ++jy) {
	    wn[jy + is * wn_dim1] = -wn1[is1 + jy * wn1_dim1];
/* L66: */
	}
	i__2 = *col;
	for (jy = iy; jy <= i__2; ++jy) {
	    wn[jy + is * wn_dim1] = wn1[is1 + jy * wn1_dim1];
/* L67: */
	}
	wn[iy + iy * wn_dim1] += sy[iy + iy * sy_dim1];
/* L70: */
    }
/*     Form the upper triangle of WN= [  LL'            L^-1(-L_a'+R_z')] */
/*                                    [(-L_a +R_z)L'^-1   S'AA'S*theta  ] */
/*        first Cholesky factor (1,1) block of wn to get LL' */
/*                          with L' stored in the upper triangle of wn. */
    dpofa_(&wn[wn_offset], &m2, col, info);
    if (*info != 0) {
	*info = -1;
	return 0;
    }
/*        then form L^-1(-L_a'+R_z') in the (1,2) block. */
    col2 = *col << 1;
    i__1 = col2;
    for (js = *col + 1; js <= i__1; ++js) {
	dtrsl_(&wn[wn_offset], &m2, col, &wn[js * wn_dim1 + 1], &c__11, info);
/* L71: */
    }
/*     Form S'AA'S*theta + (L^-1(-L_a'+R_z'))'L^-1(-L_a'+R_z') in the */
/*        upper triangle of (2,2) block of wn. */
    i__1 = col2;
    for (is = *col + 1; is <= i__1; ++is) {
	i__2 = col2;
	for (js = is; js <= i__2; ++js) {
	    wn[is + js * wn_dim1] += ddot_(col, &wn[is * wn_dim1 + 1], &c__1, 
		    &wn[js * wn_dim1 + 1], &c__1);
/* L74: */
	}
/* L72: */
    }
/*     Cholesky factorization of (2,2) block of wn. */
    dpofa_(&wn[*col + 1 + (*col + 1) * wn_dim1], &m2, col, info);
    if (*info != 0) {
	*info = -2;
	return 0;
    }
    return 0;
}